

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resource.cpp
# Opt level: O0

Link * std::pmr::addLink(test_resource_list *list,longlong index,memory_resource *pmrp)

{
  Link *pLVar1;
  Link *link;
  memory_resource *pmrp_local;
  longlong index_local;
  test_resource_list *list_local;
  
  pLVar1 = (Link *)memory_resource::allocate(pmrp,0x18,0x10);
  if (pLVar1 != (Link *)0x0) {
    pLVar1->m_next_ = (Link *)0x0;
    pLVar1->m_index_ = index;
    if (list->d_head_p == (Link *)0x0) {
      list->d_head_p = pLVar1;
      list->d_tail_p = pLVar1;
      pLVar1->m_prev_ = (Link *)0x0;
    }
    else {
      list->d_tail_p->m_next_ = pLVar1;
      pLVar1->m_prev_ = list->d_tail_p;
      list->d_tail_p = pLVar1;
    }
    return pLVar1;
  }
  __assert_fail("nullptr != link",
                "/workspace/llm4binary/github/license_c_cmakelists/bloomberg[P]p1160/stdpmr/test_resource.cpp"
                ,0xfc,"Link *std::pmr::addLink(test_resource_list *, long long, memory_resource *)")
  ;
}

Assistant:

static
Link *addLink(test_resource_list *list,
              long long           index,
              memory_resource    *pmrp)
    // Add to the specified 'list' a 'Link' having the specified 'index', and
    // using the specified 'pmrp' polymopric memory resource to supply memory;
    // also update the tail pointer of the 'list'.  Return the address of the
    // allocated 'Link'.  Note that the head pointer of the 'list' will be
    // updated if the 'list' is initially empty.
{
    Link *link = static_cast<Link *>(pmrp->allocate(sizeof(Link)));

    assert(nullptr != link);  // Ensure 'allocate' returned memory.

    link->m_next_ = nullptr;
    link->m_index_  = index;

    if (!list->d_head_p) {
        list->d_head_p = link;
        list->d_tail_p = link;
        link->m_prev_ = nullptr;
    }
    else {
        list->d_tail_p->m_next_ = link;
        link->m_prev_ = list->d_tail_p;
        list->d_tail_p = link;
    }

    return link;
}